

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

bool __thiscall cmFileLockPool::ScopePool::IsAlreadyLocked(ScopePool *this,string *filename)

{
  cmFileLock *pcVar1;
  bool bVar2;
  cmFileLock *this_00;
  long lVar3;
  cmFileLock *pcVar4;
  long lVar5;
  
  this_00 = (this->Locks).super__Vector_base<cmFileLock,_std::allocator<cmFileLock>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar1 = (this->Locks).super__Vector_base<cmFileLock,_std::allocator<cmFileLock>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pcVar1 - (long)this_00;
  for (lVar3 = lVar5 / 0x28 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = cmFileLock::IsLocked(this_00,filename);
    pcVar4 = this_00;
    if (bVar2) goto LAB_0046310d;
    bVar2 = cmFileLock::IsLocked(this_00 + 1,filename);
    pcVar4 = this_00 + 1;
    if (bVar2) goto LAB_0046310d;
    bVar2 = cmFileLock::IsLocked(this_00 + 2,filename);
    pcVar4 = this_00 + 2;
    if (bVar2) goto LAB_0046310d;
    bVar2 = cmFileLock::IsLocked(this_00 + 3,filename);
    pcVar4 = this_00 + 3;
    if (bVar2) goto LAB_0046310d;
    this_00 = this_00 + 4;
    lVar5 = lVar5 + -0xa0;
  }
  lVar5 = lVar5 / 0x28;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pcVar4 = pcVar1;
      if ((lVar5 != 3) || (bVar2 = cmFileLock::IsLocked(this_00,filename), pcVar4 = this_00, bVar2))
      goto LAB_0046310d;
      this_00 = this_00 + 1;
    }
    bVar2 = cmFileLock::IsLocked(this_00,filename);
    pcVar4 = this_00;
    if (bVar2) goto LAB_0046310d;
    this_00 = this_00 + 1;
  }
  bVar2 = cmFileLock::IsLocked(this_00,filename);
  pcVar4 = this_00;
  if (!bVar2) {
    pcVar4 = pcVar1;
  }
LAB_0046310d:
  return pcVar4 != pcVar1;
}

Assistant:

bool cmFileLockPool::ScopePool::IsAlreadyLocked(
  const std::string& filename) const
{
  return std::any_of(this->Locks.begin(), this->Locks.end(),
                     [&filename](cmFileLock const& lock) -> bool {
                       return lock.IsLocked(filename);
                     });
}